

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O2

void xercesc_4_0::DatatypeValidator::storeDV(XSerializeEngine *serEng,DatatypeValidator *dv)

{
  DatatypeValidator *pDVar1;
  size_t in_RCX;
  void *__buf;
  
  if (dv == (DatatypeValidator *)0x0) {
    XSerializeEngine::operator<<(serEng,-3);
    return;
  }
  pDVar1 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                     (DatatypeValidatorFactory::fBuiltInRegistry,dv->fTypeLocalName);
  if (pDVar1 != dv) {
    XSerializeEngine::operator<<(serEng,-2);
    XSerializeEngine::operator<<(serEng,dv->fType);
    XSerializeEngine::write(serEng,(int)dv,__buf,in_RCX);
    return;
  }
  XSerializeEngine::operator<<(serEng,-1);
  XSerializeEngine::writeString(serEng,dv->fTypeLocalName,0,false);
  return;
}

Assistant:

void DatatypeValidator::storeDV(XSerializeEngine&        serEng
                              , DatatypeValidator* const dv)
{
    if (dv)
    {
        //builtIndv
        if (dv == DatatypeValidatorFactory::getBuiltInRegistry()->get(dv->getTypeLocalName()))
        {
            serEng<<DV_BUILTIN;
            serEng.writeString(dv->getTypeLocalName());
        }
        else
        {
            serEng<<DV_NORMAL;
            serEng<<(int) dv->getType();
            serEng<<dv;
        }
    }
    else
    {
        serEng<<DV_ZERO;
    }

}